

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<TxInUndoFormatter>::Ser<AutoFile,std::vector<Coin,std::allocator<Coin>>>
          (VectorFormatter<TxInUndoFormatter> *this,AutoFile *s,
          vector<Coin,_std::allocator<Coin>_> *v)

{
  pointer pCVar1;
  value_type *elem;
  pointer txout;
  long in_FS_OFFSET;
  TxInUndoFormatter formatter;
  TxInUndoFormatter local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>
            (s,((long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  txout = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  pCVar1 = (v->super__Vector_base<Coin,_std::allocator<Coin>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (txout != pCVar1) {
    do {
      TxInUndoFormatter::Ser<AutoFile>(&local_29,s,txout);
      txout = txout + 1;
    } while (txout != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }